

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O0

void __thiscall jsoncons::jsonpath::jsonpath_error::~jsonpath_error(jsonpath_error *this,void **vtt)

{
  undefined8 *in_RSI;
  system_error *in_RDI;
  
  *(undefined8 *)in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)) = in_RSI[1];
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  std::system_error::~system_error(in_RDI);
  return;
}

Assistant:

~jsonpath_error() override = default;